

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O0

int __thiscall
leveldb::Version::PickLevelForMemTableOutput
          (Version *this,Slice *smallest_user_key,Slice *largest_user_key)

{
  bool bVar1;
  int64_t iVar2;
  int64_t iVar3;
  int64_t sum;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> overlaps;
  InternalKey limit;
  InternalKey start;
  int level;
  Slice *largest_user_key_local;
  Slice *smallest_user_key_local;
  Version *this_local;
  
  start.rep_.field_2._12_4_ = 0;
  bVar1 = OverlapInLevel(this,0,smallest_user_key,largest_user_key);
  if (!bVar1) {
    InternalKey::InternalKey
              ((InternalKey *)((long)&limit.rep_.field_2 + 8),smallest_user_key,0xffffffffffffff,
               kTypeValue);
    InternalKey::InternalKey
              ((InternalKey *)
               &overlaps.
                super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,largest_user_key,0,kTypeDeletion)
    ;
    std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::vector
              ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)&sum);
    while (((int)start.rep_.field_2._12_4_ < 2 &&
           (bVar1 = OverlapInLevel(this,start.rep_.field_2._12_4_ + 1,smallest_user_key,
                                   largest_user_key), !bVar1))) {
      if (start.rep_.field_2._12_4_ + 2 < 7) {
        GetOverlappingInputs
                  (this,start.rep_.field_2._12_4_ + 2,(InternalKey *)((long)&limit.rep_.field_2 + 8)
                   ,(InternalKey *)
                    &overlaps.
                     super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)&sum
                  );
        iVar2 = TotalFileSize((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                               *)&sum);
        iVar3 = MaxGrandParentOverlapBytes(this->vset_->options_);
        if (iVar3 < iVar2) break;
      }
      start.rep_.field_2._12_4_ = start.rep_.field_2._12_4_ + 1;
    }
    std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::~vector
              ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)&sum);
    InternalKey::~InternalKey
              ((InternalKey *)
               &overlaps.
                super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    InternalKey::~InternalKey((InternalKey *)((long)&limit.rep_.field_2 + 8));
  }
  return start.rep_.field_2._12_4_;
}

Assistant:

int Version::PickLevelForMemTableOutput(const Slice& smallest_user_key,
                                        const Slice& largest_user_key) {
  int level = 0;
  if (!OverlapInLevel(0, &smallest_user_key, &largest_user_key)) {
    // Push to next level if there is no overlap in next level,
    // and the #bytes overlapping in the level after that are limited.
    InternalKey start(smallest_user_key, kMaxSequenceNumber, kValueTypeForSeek);
    InternalKey limit(largest_user_key, 0, static_cast<ValueType>(0));
    std::vector<FileMetaData*> overlaps;
    while (level < config::kMaxMemCompactLevel) {
      if (OverlapInLevel(level + 1, &smallest_user_key, &largest_user_key)) {
        break;
      }
      if (level + 2 < config::kNumLevels) {
        // Check that file does not overlap too many grandparent bytes.
        GetOverlappingInputs(level + 2, &start, &limit, &overlaps);
        const int64_t sum = TotalFileSize(overlaps);
        if (sum > MaxGrandParentOverlapBytes(vset_->options_)) {
          break;
        }
      }
      level++;
    }
  }
  return level;
}